

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

uint __thiscall ThreadContext::GetRedeferralCollectionInterval(ThreadContext *this)

{
  RedeferralState RVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ThreadContext *this_local;
  
  RVar1 = this->redeferralState;
  if (RVar1 == InitialRedeferralState) {
    this_local._4_4_ = 5;
  }
  else if (RVar1 == StartupRedeferralState) {
    this_local._4_4_ = 10;
  }
  else if (RVar1 == MainRedeferralState) {
    this_local._4_4_ = 0x14;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xadb,"(0)","0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

uint
ThreadContext::GetRedeferralCollectionInterval() const
{
    switch(this->redeferralState)
    {
        case InitialRedeferralState:
            return InitialRedeferralDelay;

        case StartupRedeferralState:
            return StartupRedeferralCheckInterval;

        case MainRedeferralState:
            return MainRedeferralCheckInterval;

        default:
            Assert(0);
            return (uint)-1;
    }
}